

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_tree(archive_write *a,isoent **isoentpp)

{
  iso9660_conflict *iso9660;
  isoent *isoent;
  size_t sVar1;
  isofile *piVar2;
  archive_string *dest;
  int iVar3;
  uint uVar4;
  mode_t mVar5;
  mode_t mVar6;
  isoent *piVar7;
  isoent *piVar8;
  char *pcVar9;
  char *pcVar10;
  isoent *__s2;
  isoent *extraout_RDX;
  char *fn;
  isoent *n;
  isofile *piVar11;
  isoent *parent;
  ulong uVar12;
  archive_string local_158;
  archive_string *local_140;
  char name [256];
  
  iso9660 = (iso9660_conflict *)a->format_data;
  isoent = *isoentpp;
  sVar1 = (isoent->file->parentdir).length;
  if (sVar1 == 0) {
    __s2 = (isoent *)0x2317e7;
  }
  else {
    __s2 = (isoent *)(isoent->file->parentdir).s;
  }
  parent = (iso9660->primary).rootent;
  local_140 = &iso9660->cur_dirstr;
  piVar8 = isoent;
  n = __s2;
  if (((iso9660->cur_dirstr).length == sVar1) &&
     (iVar3 = strcmp(local_140->s,(char *)__s2), piVar8 = extraout_RDX, iVar3 == 0)) {
    iVar3 = isoent_add_child_tail(iso9660->cur_dirent,isoent);
    if (iVar3 == 0) {
      piVar7 = (isoent *)
               __archive_rb_tree_find_node(&iso9660->cur_dirent->rbtree,(isoent->file->basename).s);
LAB_00165014:
      piVar11 = piVar7->file;
      piVar2 = isoent->file;
      mVar5 = archive_entry_filetype(piVar11->entry);
      mVar6 = archive_entry_filetype(piVar2->entry);
      if (mVar5 != mVar6) {
        pcVar10 = archive_entry_pathname(piVar11->entry);
        archive_set_error(&a->archive,-1,
                          "Found duplicate entries `%s\' and its file type is different",pcVar10);
LAB_0016507a:
        _isoent_free(isoent);
        *isoentpp = (isoent *)0x0;
        return -0x19;
      }
      piVar7->file = piVar2;
      isoent->file = piVar11;
      piVar7->field_0xe8 = piVar7->field_0xe8 & 0xfe;
      _isoent_free(isoent);
      *isoentpp = piVar7;
    }
LAB_00165051:
    iVar3 = 0;
  }
  else {
    while( true ) {
      uVar4 = get_path_component(name,(size_t)n,(char *)piVar8);
      if (uVar4 == 0) break;
      if ((int)uVar4 < 0) {
        archive_set_error(&a->archive,-1,"A name buffer is too small");
        _isoent_free(isoent);
        goto LAB_00164fae;
      }
      piVar7 = (isoent *)__archive_rb_tree_find_node(&parent->rbtree,name);
      if (piVar7 == (isoent *)0x0) break;
      if (*(char *)(n->rbnode).rb_nodes == '\0') goto LAB_00165014;
      if ((piVar7->field_0xe8 & 2) == 0) {
        pcVar10 = archive_entry_pathname(piVar7->file->entry);
        pcVar9 = archive_entry_pathname(isoent->file->entry);
        archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar10,
                          pcVar9);
        goto LAB_0016507a;
      }
      piVar8 = (isoent *)
               ((long)(n->rbnode).rb_nodes +
               (ulong)(*(char *)((long)(n->rbnode).rb_nodes + (ulong)uVar4) == '/') + (ulong)uVar4);
      n = piVar8;
      parent = piVar7;
    }
    do {
      dest = local_140;
      if (*(char *)(n->rbnode).rb_nodes == '\0') {
        iso9660->cur_dirent = parent;
        (iso9660->cur_dirstr).length = 0;
        archive_string_ensure
                  (local_140,(parent->file->parentdir).length + (parent->file->basename).length + 2)
        ;
        piVar11 = parent->file;
        sVar1 = (piVar11->parentdir).length;
        if ((piVar11->basename).length + sVar1 == 0) {
          *dest->s = '\0';
        }
        else {
          if (sVar1 != 0) {
            (iso9660->cur_dirstr).length = 0;
            archive_string_concat(dest,&piVar11->parentdir);
            archive_strappend_char(dest,'/');
            piVar11 = parent->file;
          }
          archive_string_concat(dest,&piVar11->basename);
        }
        iVar3 = isoent_add_child_tail(parent,isoent);
        if (iVar3 != 0) goto LAB_00165051;
        piVar7 = (isoent *)__archive_rb_tree_find_node(&parent->rbtree,(isoent->file->basename).s);
        goto LAB_00165014;
      }
      uVar12 = (ulong)uVar4;
      local_158.s = (char *)0x0;
      local_158.length = 0;
      local_158.buffer_length = 0;
      archive_strncat(&local_158,__s2,(long)n + (uVar12 - (long)__s2));
      if (local_158.s[local_158.length - 1] == '/') {
        local_158.s[local_158.length - 1] = '\0';
        local_158.length = local_158.length - 1;
      }
      piVar8 = isoent_create_virtual_dir(a,iso9660,local_158.s);
      archive_string_free(&local_158);
      if (piVar8 == (isoent *)0x0) {
        pcVar10 = "Can\'t allocate memory";
        iVar3 = 0xc;
        goto LAB_00164f8f;
      }
      iVar3 = piVar8->file->dircnt;
      if (iso9660->dircnt_max < iVar3) {
        iso9660->dircnt_max = iVar3;
      }
      isoent_add_child_tail(parent,piVar8);
      n = (isoent *)
          ((long)(n->rbnode).rb_nodes +
          (*(char *)((long)(n->rbnode).rb_nodes + uVar12) == '/') + uVar12);
      uVar4 = get_path_component(name,(size_t)n,fn);
      parent = piVar8;
    } while (-1 < (int)uVar4);
    archive_string_free(&local_158);
    pcVar10 = "A name buffer is too small";
    iVar3 = -1;
LAB_00164f8f:
    archive_set_error(&a->archive,iVar3,pcVar10);
    _isoent_free(isoent);
    *isoentpp = (isoent *)0x0;
LAB_00164fae:
    iVar3 = -0x1e;
  }
  return iVar3;
}

Assistant:

static int
isoent_tree(struct archive_write *a, struct isoent **isoentpp)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *dent, *isoent, *np;
	struct isofile *f1, *f2;
	const char *fn, *p;
	int l;

	isoent = *isoentpp;
	dent = iso9660->primary.rootent;
	if (isoent->file->parentdir.length > 0)
		fn = p = isoent->file->parentdir.s;
	else
		fn = p = "";

	/*
	 * If the path of the parent directory of `isoent' entry is
	 * the same as the path of `cur_dirent', add isoent to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(iso9660->cur_dirstr))
	      == archive_strlen(&(isoent->file->parentdir)) &&
	    strcmp(iso9660->cur_dirstr.s, fn) == 0) {
		if (!isoent_add_child_tail(iso9660->cur_dirent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(iso9660->cur_dirent->rbtree),
			    isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			_isoent_free(isoent);
			return (ARCHIVE_FATAL);
		}

		np = isoent_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next subdirectory. */
		if (!np->dir) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    archive_entry_pathname(np->file->entry),
			    archive_entry_pathname(isoent->file->entry));
			_isoent_free(isoent);
			*isoentpp = NULL;
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct isoent *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			vp = isoent_create_virtual_dir(a, iso9660, as.s);
			if (vp == NULL) {
				archive_string_free(&as);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			archive_string_free(&as);

			if (vp->file->dircnt > iso9660->dircnt_max)
				iso9660->dircnt_max = vp->file->dircnt;
			isoent_add_child_tail(dent, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where isoent can be
		 * inserted. */
		iso9660->cur_dirent = dent;
		archive_string_empty(&(iso9660->cur_dirstr));
		archive_string_ensure(&(iso9660->cur_dirstr),
		    archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) + 2);
		if (archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) == 0)
			iso9660->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->file->parentdir)) > 0) {
				archive_string_copy(&(iso9660->cur_dirstr),
				    &(dent->file->parentdir));
				archive_strappend_char(&(iso9660->cur_dirstr), '/');
			}
			archive_string_concat(&(iso9660->cur_dirstr),
			    &(dent->file->basename));
		}

		if (!isoent_add_child_tail(dent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(dent->rbtree), isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	f1 = np->file;
	f2 = isoent->file;

	/* If the file type of entries is different,
	 * we cannot handle it. */
	if (archive_entry_filetype(f1->entry) !=
	    archive_entry_filetype(f2->entry)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found duplicate entries `%s' and its file type is "
		    "different",
		    archive_entry_pathname(f1->entry));
		_isoent_free(isoent);
		*isoentpp = NULL;
		return (ARCHIVE_FAILED);
	}

	/* Swap file entries. */
	np->file = f2;
	isoent->file = f1;
	np->virtual = 0;

	_isoent_free(isoent);
	*isoentpp = np;
	return (ARCHIVE_OK);
}